

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sift.cc
# Opt level: O2

bool __thiscall
features::Sift::descriptor_assignment(Sift *this,Keypoint *kp,Descriptor *desc,Octave *octave)

{
  Vector<float,_128> *this_00;
  float fVar1;
  float fVar2;
  int iVar3;
  uint uVar4;
  bool bVar5;
  bool bVar6;
  int y;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  int dx;
  int iVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float __x;
  float __x_00;
  long local_f8;
  ConstPtr grad;
  ConstPtr ori;
  uint local_a0 [2];
  int bxi [2];
  int byi [2];
  float gaussian_sigma;
  float local_78 [2];
  float weights [3] [2];
  int local_54 [2];
  int bti [2];
  
  fVar20 = kp->sample;
  fVar1 = kp->x;
  fVar2 = kp->y;
  if (fVar20 <= 0.0) {
    fVar18 = ceilf(fVar20 + -0.5);
  }
  else {
    fVar18 = floorf(fVar20 + 0.5);
  }
  fVar19 = (this->options).base_blur_sigma;
  bti[1] = (int)exp2f((fVar20 + 1.0) / (float)(this->options).num_samples_per_octave);
  std::__shared_ptr<core::Image<float>const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<core::Image<float>,void>
            ((__shared_ptr<core::Image<float>const,(__gnu_cxx::_Lock_policy)2> *)&local_f8,
             &(octave->grad).
              super__Vector_base<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[(long)(int)fVar18 + 1].
              super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<core::Image<float>const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<core::Image<float>,void>
            ((__shared_ptr<core::Image<float>const,(__gnu_cxx::_Lock_policy)2> *)
             &grad.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(octave->ori).
              super__Vector_base<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[(long)(int)fVar18 + 1].
              super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>);
  iVar3 = *(int *)(local_f8 + 8);
  iVar7 = *(int *)(local_f8 + 0xc);
  this_00 = &desc->data;
  local_78[0] = 0.0;
  math::Vector<float,_128>::fill(this_00,local_78);
  iVar14 = (int)(fVar1 + 0.5);
  iVar16 = (int)(fVar2 + 0.5);
  fVar19 = fVar19 * (float)bti[1];
  fVar20 = sinf(desc->orientation);
  bti[0] = (int)cosf(desc->orientation);
  fVar19 = fVar19 * 3.0;
  iVar13 = (int)(fVar19 * 1.4142135 * 5.0 * 0.5);
  bVar5 = iVar13 + iVar14 < iVar3;
  bVar6 = iVar13 + iVar16 < iVar7;
  if (bVar6 && ((iVar13 <= iVar16 && iVar13 <= iVar14) && bVar5)) {
    iVar7 = -iVar13;
    lVar9 = (long)iVar7;
    ori.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(long)iVar13;
    for (; iVar7 <= iVar13; iVar7 = iVar7 + 1) {
      fVar18 = (float)iVar7 + ((float)iVar16 - fVar2);
      fVar21 = fVar18 * (float)bti[0];
      for (lVar15 = lVar9;
          lVar15 <= (long)ori.
                          super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi; lVar15 = lVar15 + 1) {
        lVar8 = (long)((iVar7 + iVar16) * iVar3 + iVar14 + (int)lVar15);
        fVar22 = *(float *)(*(long *)&grad.
                                      super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi[1]._M_use_count + lVar8 * 4) -
                 desc->orientation;
        fVar23 = (float)(int)lVar15 + ((float)iVar14 - fVar1);
        __x_00 = ((float)bti[0] * fVar23 + fVar20 * fVar18) / fVar19 + 1.5;
        __x = (fVar23 * -fVar20 + fVar21) / fVar19 + 1.5;
        local_78[0] = (__x_00 + -1.5) * (__x_00 + -1.5) + (__x + -1.5) * (__x + -1.5);
        bti[1] = *(int *)(*(long *)(local_f8 + 0x18) + lVar8 * 4);
        fVar22 = ((float)(-(uint)(fVar22 < 0.0) & (uint)(fVar22 + 6.2831855) |
                         ~-(uint)(fVar22 < 0.0) & (uint)fVar22) * 8.0) / 6.2831855 + -0.5;
        byi[0] = 0x40000000;
        byi[1] = (int)math::gaussian_xx<float>(local_78,(float *)byi);
        fVar23 = floorf(__x_00);
        local_a0[0] = (uint)fVar23;
        iVar11 = local_a0[0] + 1;
        local_a0[1] = iVar11;
        fVar23 = floorf(__x);
        bxi[0] = (int)fVar23;
        iVar17 = bxi[0] + 1;
        bxi[1] = iVar17;
        fVar23 = floorf(fVar22);
        local_54[0] = (int)fVar23;
        local_54[1] = local_54[0] + 1;
        fVar23 = (float)iVar11;
        local_78[0] = fVar23 - __x_00;
        local_78[1] = (__x_00 - fVar23) + 1.0;
        fVar23 = (float)iVar17;
        weights[0][0] = fVar23 - __x;
        weights[0][1] = (__x - fVar23) + 1.0;
        weights[1][0] = (float)local_54[1] - fVar22;
        weights[1][1] = (fVar22 - (float)local_54[1]) + 1.0;
        if (local_54[0] < 0) {
          local_54[0] = local_54[0] + 8;
        }
        else if (7 < (uint)local_54[1]) {
          local_54[1] = local_54[0] - 7;
        }
        for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
          for (lVar10 = 0; lVar10 != 2; lVar10 = lVar10 + 1) {
            uVar4 = local_a0[lVar10];
            for (lVar12 = 0; lVar12 != 2; lVar12 = lVar12 + 1) {
              if ((uVar4 < 4) && ((uint)bxi[lVar8] < 4)) {
                iVar11 = (bxi[lVar8] << 5 | uVar4 * 8) + local_54[lVar12];
                this_00->v[iVar11] =
                     local_78[lVar10] * (float)bti[1] * (float)byi[1] * weights[0][lVar8] *
                     weights[1][lVar12] + this_00->v[iVar11];
              }
            }
          }
        }
      }
    }
    math::Vector<float,_128>::normalize(this_00);
    for (lVar9 = 0; lVar9 != 0x80; lVar9 = lVar9 + 1) {
      fVar20 = 0.2;
      if (this_00->v[lVar9] <= 0.2) {
        fVar20 = this_00->v[lVar9];
      }
      this_00->v[lVar9] = fVar20;
    }
    math::Vector<float,_128>::normalize(this_00);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&ori);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&grad);
  return bVar6 && ((iVar13 <= iVar16 && iVar13 <= iVar14) && bVar5);
}

Assistant:

bool
Sift::descriptor_assignment (Keypoint const& kp, Descriptor& desc,
    Octave const* octave)
{
    /*
     * The final feature vector has size PXB * PXB * OHB.
     * The following constants should not be changed yet, as the
     * (PXB^2 * OHB = 128) element feature vector is still hard-coded.
     */
    //int const PIX = 16; // Descriptor region with 16x16 pixel
    int const PXB = 4; // Pixel bins with 4x4 bins
    int const OHB = 8; // Orientation histogram with 8 bins

    /* Integral x and y coordinates and closest scale sample. */
    int const ix = static_cast<int>(kp.x + 0.5f);
    int const iy = static_cast<int>(kp.y + 0.5f);
    int const is = static_cast<int>(math::round(kp.sample));
    float const dxf = kp.x - static_cast<float>(ix);
    float const dyf = kp.y - static_cast<float>(iy);
    float const sigma = this->keypoint_relative_scale(kp);

    /* Images with its dimension for the keypoint. */
    core::FloatImage::ConstPtr grad(octave->grad[is + 1]);
    core::FloatImage::ConstPtr ori(octave->ori[is + 1]);
    int const width = grad->width();
    int const height = grad->height();

    /* Clear feature vector. */
    desc.data.fill(0.0f);

    /* Rotation constants given by descriptor orientation. */
    float const sino = std::sin(desc.orientation);
    float const coso = std::cos(desc.orientation);

    /*
     * Compute window size.
     * Each spacial bin has an extension of 3 * sigma (sigma is the scale
     * of the keypoint). For interpolation we need another half bin at
     * both ends in each dimension. And since the window can be arbitrarily
     * rotated, we need to multiply with sqrt(2). The window size is:
     * 2W = sqrt(2) * 3 * sigma * (PXB + 1).
     */
    float const binsize = 3.0f * sigma;
    int win = MATH_SQRT2 * binsize * (float)(PXB + 1) * 0.5f;
    if (ix < win || ix + win >= width || iy < win || iy + win >= height)
        return false;

    /*
     * Iterate over the window, intersected with the image region
     * from (1,1) to (w-2, h-2) since gradients/orientations are
     * not defined at the boundary pixels. Add all samples to the
     * corresponding bin.
     */
    int const center = iy * width + ix; // Center pixel at KP location
    for (int dy = -win; dy <= win; ++dy)
    {
        int const yoff = dy * width;
        for (int dx = -win; dx <= win; ++dx)
        {
            /* Get pixel gradient magnitude and orientation. */
            float const mod = grad->at(center + yoff + dx);
            float const angle = ori->at(center + yoff + dx);
            float theta = angle - desc.orientation;
            if (theta < 0.0f)
                theta += 2.0f * MATH_PI;

            /* Compute fractional coordinates w.r.t. the window. */
            float const winx = (float)dx - dxf;
            float const winy = (float)dy - dyf;

            /*
             * Compute normalized coordinates w.r.t. bins. The window
             * coordinates are rotated around the keypoint. The bins are
             * chosen such that 0 is the coordinate of the first bins center
             * in each dimension. In other words, (0,0,0) is the coordinate
             * of the first bin center in the three dimensional histogram.
             */
            float binoff = (float)(PXB - 1) / 2.0f;
            float binx = (coso * winx + sino * winy) / binsize + binoff;
            float biny = (-sino * winx + coso * winy) / binsize + binoff;
            float bint = theta * (float)OHB / (2.0f * MATH_PI) - 0.5f;

            /* Compute circular window weight for the sample. */
            float gaussian_sigma = 0.5f * (float)PXB;
            float gaussian_weight = math::gaussian_xx
                (MATH_POW2(binx - binoff) + MATH_POW2(biny - binoff),
                gaussian_sigma);

            /* Total contribution of the sample in the histogram is now: */
            float contrib = mod * gaussian_weight;

            /*
             * Distribute values into bins (using trilinear interpolation).
             * Each sample is inserted into 8 bins. Some of these bins may
             * not exist, because the sample is outside the keypoint window.
             */
            int bxi[2] = { (int)std::floor(binx), (int)std::floor(binx) + 1 };
            int byi[2] = { (int)std::floor(biny), (int)std::floor(biny) + 1 };
            int bti[2] = { (int)std::floor(bint), (int)std::floor(bint) + 1 };

            float weights[3][2] = {
                { (float)bxi[1] - binx, 1.0f - ((float)bxi[1] - binx) },
                { (float)byi[1] - biny, 1.0f - ((float)byi[1] - biny) },
                { (float)bti[1] - bint, 1.0f - ((float)bti[1] - bint) }
            };

            // Wrap around orientation histogram
            if (bti[0] < 0)
                bti[0] += OHB;
            if (bti[1] >= OHB)
                bti[1] -= OHB;

            /* Iterate the 8 bins and add weighted contrib to each. */
            int const xstride = OHB;
            int const ystride = OHB * PXB;
            for (int y = 0; y < 2; ++y)
                for (int x = 0; x < 2; ++x)
                    for (int t = 0; t < 2; ++t)
                    {
                        if (bxi[x] < 0 || bxi[x] >= PXB
                            || byi[y] < 0 || byi[y] >= PXB)
                            continue;

                        int idx = bti[t] + bxi[x] * xstride + byi[y] * ystride;
                        desc.data[idx] += contrib * weights[0][x]
                            * weights[1][y] * weights[2][t];
                    }
        }
    }

    /* Normalize the feature vector. */
    desc.data.normalize();

    /* Truncate descriptor values to 0.2. */
    for (int i = 0; i < PXB * PXB * OHB; ++i)
        desc.data[i] = std::min(desc.data[i], 0.2f);

    /* Normalize once again. */
    desc.data.normalize();

    return true;
}